

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void absl::StrAppend(string *dest,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  bool bVar1;
  reference pcVar2;
  AlphaNum *s;
  size_type sVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  char *out;
  reference local_40;
  char *begin;
  size_type old_size;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *dest_local;
  
  old_size = (size_type)d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = (AlphaNum *)dest;
  sVar3 = AlphaNum::size(a);
  bVar1 = true;
  if (sVar3 != 0) {
    pcVar4 = AlphaNum::data(b_local);
    lVar5 = std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::size();
    bVar1 = uVar6 < (ulong)((long)pcVar4 - lVar5);
  }
  if (!bVar1) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe0,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar3 = AlphaNum::size(c_local);
  bVar1 = true;
  if (sVar3 != 0) {
    pcVar4 = AlphaNum::data(c_local);
    lVar5 = std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::size();
    bVar1 = uVar6 < (ulong)((long)pcVar4 - lVar5);
  }
  if (!bVar1) {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe1,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar3 = AlphaNum::size(d_local);
  bVar1 = true;
  if (sVar3 != 0) {
    pcVar4 = AlphaNum::data(d_local);
    lVar5 = std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::size();
    bVar1 = uVar6 < (ulong)((long)pcVar4 - lVar5);
  }
  if (!bVar1) {
    __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe2,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar3 = AlphaNum::size((AlphaNum *)old_size);
  bVar1 = true;
  if (sVar3 != 0) {
    pcVar4 = AlphaNum::data((AlphaNum *)old_size);
    lVar5 = std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::size();
    bVar1 = uVar6 < (ulong)((long)pcVar4 - lVar5);
  }
  if (!bVar1) {
    __assert_fail("((d).size() == 0) || (uintptr_t((d).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe3,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  pcVar4 = (char *)std::__cxx11::string::size();
  s = a_local;
  begin = pcVar4;
  sVar3 = AlphaNum::size(b_local);
  sVar7 = AlphaNum::size(c_local);
  sVar8 = AlphaNum::size(d_local);
  sVar9 = AlphaNum::size((AlphaNum *)old_size);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,
             (size_t)(pcVar4 + sVar9 + sVar8 + sVar7 + sVar3));
  out = (char *)std::__cxx11::string::begin();
  local_40 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  pcVar4 = Append(local_40 + (long)begin,b_local);
  pcVar4 = Append(pcVar4,c_local);
  pcVar4 = Append(pcVar4,d_local);
  pcVar4 = Append(pcVar4,(AlphaNum *)old_size);
  pcVar2 = local_40;
  lVar5 = std::__cxx11::string::size();
  if (pcVar4 == pcVar2 + lVar5) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                ,0xed,
                "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(string* dest, const AlphaNum& a, const AlphaNum& b,
               const AlphaNum& c, const AlphaNum& d) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  ASSERT_NO_OVERLAP(*dest, d);
  string::size_type old_size = dest->size();
  strings_internal::STLStringResizeUninitialized(
      dest, old_size + a.size() + b.size() + c.size() + d.size());
  char* const begin = &*dest->begin();
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  out = Append(out, d);
  assert(out == begin + dest->size());
}